

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-wrap.cpp
# Opt level: O0

CommandOptions * write_PCM_file(CommandOptions *Options)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  reference ppIVar6;
  ulong uVar7;
  byte_t *value;
  AESEncContext *this;
  HMACContext *this_00;
  long in_RSI;
  double dVar8;
  long local_828;
  Result_t local_7c0 [104];
  FrameBuffer local_758 [104];
  FrameBuffer local_6f0 [2];
  uint local_684;
  Result_t local_680 [4];
  ui32_t duration;
  allocator<char> local_611;
  string local_610 [32];
  string local_5f0 [104];
  Result_t local_588 [104];
  Result_t local_520 [104];
  Result_t local_4b8 [111];
  FortunaRNG local_449;
  undefined1 local_448 [7];
  FortunaRNG RNG;
  byte_t IV_buf [16];
  undefined1 local_430 [8];
  WriterInfo Info;
  UTF16String local_360 [40];
  UTF16String local_338 [40];
  long local_310;
  SoundfieldGroupLabelSubDescriptor *desc;
  _List_node_base *local_300;
  _List_iterator<ASDCP::MXF::InterchangeObject_*> local_2f8;
  iterator i;
  AudioDescriptor local_2e8 [2];
  ui32_t local_27c;
  char local_278 [8];
  char buf [64];
  AudioDescriptor local_1d0 [2];
  undefined1 local_168 [8];
  AudioDescriptor ADesc;
  Result_t result;
  Rational *local_d0;
  WaveAudioDescriptor *essence_descriptor;
  FrameBuffer FrameBuffer;
  undefined1 local_90 [8];
  MXFWriter Writer;
  PCMParserList Parser;
  HMACContext *HMAC;
  AESEncContext *Context;
  CommandOptions *Options_local;
  
  ASDCP::PCMParserList::PCMParserList((PCMParserList *)&stack0xffffffffffffff80);
  AS_02::PCM::MXFWriter::MXFWriter((MXFWriter *)local_90);
  ASDCP::PCM::FrameBuffer::FrameBuffer((FrameBuffer *)&essence_descriptor);
  local_d0 = (Rational *)0x0;
  ASDCP::PCMParserList::OpenRead
            ((list *)&ADesc.ContainerDuration,(Rational *)&stack0xffffffffffffff80);
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&ADesc.ContainerDuration);
  if (-1 < iVar3) {
    ASDCP::PCM::AudioDescriptor::AudioDescriptor((AudioDescriptor *)local_168);
    ASDCP::PCMParserList::FillAudioDescriptor(local_1d0);
    Kumu::Result_t::~Result_t((Result_t *)local_1d0);
    local_168 = *(undefined1 (*) [8])(in_RSI + 0x18);
    ASDCP::PCM::CalcFrameBufferSize((AudioDescriptor *)local_168);
    ASDCP::FrameBuffer::Capacity((int)buf + 0x38);
    Kumu::Result_t::~Result_t((Result_t *)(buf + 0x38));
    pFVar1 = _stderr;
    if ((*(byte *)(in_RSI + 5) & 1) != 0) {
      dVar8 = ASDCP::Rational::Quotient(&ADesc.EditRate);
      local_27c = 0x40;
      pcVar5 = RationalToString((Rational *)(in_RSI + 0x18),local_278,&local_27c);
      ASDCP::PCM::CalcSamplesPerFrame((AudioDescriptor *)local_168);
      fprintf(pFVar1,"%.1fkHz PCM Audio, %s fps (%u spf)\n",dVar8 / 1000.0,pcVar5);
      fputs("AudioDescriptor:\n",_stderr);
      ASDCP::PCM::AudioDescriptorDump((AudioDescriptor *)local_168,(_IO_FILE *)0x0);
    }
    local_d0 = (Rational *)operator_new(0x1e8);
    ASDCP::MXF::WaveAudioDescriptor::WaveAudioDescriptor((WaveAudioDescriptor *)local_d0,g_dict);
    ASDCP::PCM_ADesc_to_MD(local_2e8,(WaveAudioDescriptor *)local_168);
    Kumu::Result_t::operator=((Result_t *)&ADesc.ContainerDuration,(Result_t *)local_2e8);
    Kumu::Result_t::~Result_t((Result_t *)local_2e8);
    bVar2 = std::__cxx11::
            list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
            ::empty((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                     *)(in_RSI + 0x110));
    if (bVar2) {
      ASDCP::MXF::optional_property<ASDCP::UL>::operator=
                ((optional_property<ASDCP::UL> *)(local_d0 + 0x38),(UL *)(in_RSI + 0x70));
    }
    else {
      iVar3 = ASDCP::MXF::ASDCP_MCAConfigParser::ChannelCount();
      pFVar1 = _stderr;
      if (iVar3 != local_d0[0x2d].Numerator) {
        uVar4 = ASDCP::MXF::ASDCP_MCAConfigParser::ChannelCount();
        fprintf(pFVar1,"MCA label count (%d) differs from essence stream channel count (%d).\n",
                (ulong)uVar4,(ulong)(uint)local_d0[0x2d].Numerator);
        Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)Kumu::RESULT_FAIL);
        goto LAB_0011aa2f;
      }
      std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::_List_iterator(&local_2f8);
      local_300 = (_List_node_base *)
                  std::__cxx11::
                  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                  ::begin((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                           *)(in_RSI + 0x110));
      local_2f8._M_node = local_300;
      while( true ) {
        desc = (SoundfieldGroupLabelSubDescriptor *)
               std::__cxx11::
               list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
               ::end((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                      *)(in_RSI + 0x110));
        bVar2 = std::operator!=(&local_2f8,(_Self *)&desc);
        if (!bVar2) break;
        ppIVar6 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_2f8);
        if (*ppIVar6 == (InterchangeObject *)0x0) {
          local_828 = 0;
        }
        else {
          local_828 = __dynamic_cast(*ppIVar6,&ASDCP::MXF::InterchangeObject::typeinfo,
                                     &ASDCP::MXF::SoundfieldGroupLabelSubDescriptor::typeinfo);
        }
        local_310 = local_828;
        if (local_828 != 0) {
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            ASDCP::MXF::UTF16String::UTF16String(local_338,(string *)(in_RSI + 0x2c8));
            ASDCP::MXF::optional_property<ASDCP::MXF::UTF16String>::operator=
                      ((optional_property<ASDCP::MXF::UTF16String> *)(local_310 + 0x290),local_338);
            ASDCP::MXF::UTF16String::~UTF16String(local_338);
          }
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            ASDCP::MXF::UTF16String::UTF16String(local_360,(string *)(in_RSI + 0x2a8));
            ASDCP::MXF::optional_property<ASDCP::MXF::UTF16String>::operator=
                      ((optional_property<ASDCP::MXF::UTF16String> *)(local_310 + 0x2c0),local_360);
            ASDCP::MXF::UTF16String::~UTF16String(local_360);
          }
        }
        std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator++(&local_2f8);
      }
      value = ASDCP::Dictionary::ul(g_dict,MDD_IMFAudioChannelCfg_MCA);
      ASDCP::UL::UL((UL *)&Info.LabelSetType,value);
      ASDCP::MXF::optional_property<ASDCP::UL>::operator=
                ((optional_property<ASDCP::UL> *)(local_d0 + 0x38),(UL *)&Info.LabelSetType);
      ASDCP::UL::~UL((UL *)&Info.LabelSetType);
    }
  }
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&ADesc.ContainerDuration);
  if ((-1 < iVar3) && ((*(byte *)(in_RSI + 0xc) & 1) == 0)) {
    ASDCP::WriterInfo::WriterInfo((WriterInfo *)local_430,&s_MyInfo.super_WriterInfo);
    Info.ProductName.field_2._8_4_ = 2;
    if ((*(byte *)(in_RSI + 2) & 1) == 0) {
      Kumu::GenRandomUUID(Info.ProductUUID + 8);
    }
    else {
      Info.ProductUUID._8_8_ = *(undefined8 *)(in_RSI + 0x45);
      Info.AssetUUID._0_8_ = *(undefined8 *)(in_RSI + 0x4d);
    }
    if ((*(byte *)(in_RSI + 1) & 1) != 0) {
      Kumu::FortunaRNG::FortunaRNG(&local_449);
      Kumu::GenRandomUUID(Info.AssetUUID + 8);
      Info.CryptographicKeyID[8] = '\x01';
      if ((*(byte *)(in_RSI + 0x34) & 1) == 0) {
        create_random_uuid(Info.ContextID + 8);
      }
      else {
        Info.ContextID._8_8_ = *(undefined8 *)(in_RSI + 0x35);
        Info.CryptographicKeyID._0_8_ = *(undefined8 *)(in_RSI + 0x3d);
      }
      this = (AESEncContext *)operator_new(8);
      ASDCP::AESEncContext::AESEncContext(this);
      ASDCP::AESEncContext::InitKey((uchar *)local_4b8);
      Kumu::Result_t::operator=((Result_t *)&ADesc.ContainerDuration,local_4b8);
      Kumu::Result_t::~Result_t(local_4b8);
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&ADesc.ContainerDuration);
      if (-1 < iVar3) {
        Kumu::FortunaRNG::FillRandom((uchar *)&local_449,(uint)local_448);
        ASDCP::AESEncContext::SetIVec((uchar *)local_520);
        Kumu::Result_t::operator=((Result_t *)&ADesc.ContainerDuration,local_520);
        Kumu::Result_t::~Result_t(local_520);
      }
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&ADesc.ContainerDuration);
      if ((-1 < iVar3) && ((*(byte *)(in_RSI + 4) & 1) != 0)) {
        Info.CryptographicKeyID[9] = '\x01';
        this_00 = (HMACContext *)operator_new(8);
        ASDCP::HMACContext::HMACContext(this_00);
        ASDCP::HMACContext::InitKey((uchar *)local_588,(LabelSet_t)this_00);
        Kumu::Result_t::operator=((Result_t *)&ADesc.ContainerDuration,local_588);
        Kumu::Result_t::~Result_t(local_588);
      }
      Kumu::FortunaRNG::~FortunaRNG(&local_449);
    }
    iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&ADesc.ContainerDuration);
    if (-1 < iVar3) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_610,pcVar5,&local_611);
      AS_02::PCM::MXFWriter::OpenWrite
                (local_5f0,(WriterInfo *)local_90,(FileDescriptor *)local_610,(list *)local_430,
                 local_d0,(int)in_RSI + 0x110);
      Kumu::Result_t::operator=((Result_t *)&ADesc.ContainerDuration,(Result_t *)local_5f0);
      Kumu::Result_t::~Result_t((Result_t *)local_5f0);
      std::__cxx11::string::~string(local_610);
      std::allocator<char>::~allocator(&local_611);
    }
    ASDCP::WriterInfo::~WriterInfo((WriterInfo *)local_430);
  }
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&ADesc.ContainerDuration);
  if (-1 < iVar3) {
    ASDCP::PCMParserList::Reset();
    Kumu::Result_t::operator=((Result_t *)&ADesc.ContainerDuration,local_680);
    Kumu::Result_t::~Result_t(local_680);
    local_684 = 0;
    while( true ) {
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&ADesc.ContainerDuration);
      bVar2 = false;
      if (-1 < iVar3) {
        bVar2 = local_684 < *(uint *)(in_RSI + 0x10);
        local_684 = local_684 + 1;
      }
      if (!bVar2) break;
      ASDCP::PCMParserList::ReadFrame(local_6f0);
      Kumu::Result_t::operator=((Result_t *)&ADesc.ContainerDuration,(Result_t *)local_6f0);
      Kumu::Result_t::~Result_t((Result_t *)local_6f0);
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&ADesc.ContainerDuration);
      if (-1 < iVar3) {
        if ((*(byte *)(in_RSI + 5) & 1) != 0) {
          ASDCP::PCM::FrameBuffer::Dump((_IO_FILE *)&essence_descriptor,(uint)_stderr);
        }
        if ((*(byte *)(in_RSI + 0xc) & 1) == 0) {
          AS_02::PCM::MXFWriter::WriteFrame
                    (local_758,(AESEncContext *)local_90,(HMACContext *)&essence_descriptor);
          Kumu::Result_t::operator=((Result_t *)&ADesc.ContainerDuration,(Result_t *)local_758);
          Kumu::Result_t::~Result_t((Result_t *)local_758);
        }
      }
    }
    bVar2 = Kumu::Result_t::operator==
                      ((Result_t *)&ADesc.ContainerDuration,(Result_t *)Kumu::RESULT_ENDOFFILE);
    if (bVar2) {
      Kumu::Result_t::operator=((Result_t *)&ADesc.ContainerDuration,(Result_t *)Kumu::RESULT_OK);
    }
  }
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)&ADesc.ContainerDuration);
  if ((-1 < iVar3) && ((*(byte *)(in_RSI + 0xc) & 1) == 0)) {
    AS_02::PCM::MXFWriter::Finalize();
    Kumu::Result_t::operator=((Result_t *)&ADesc.ContainerDuration,local_7c0);
    Kumu::Result_t::~Result_t(local_7c0);
  }
  Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)&ADesc.ContainerDuration);
LAB_0011aa2f:
  i._M_node._4_4_ = 1;
  Kumu::Result_t::~Result_t((Result_t *)&ADesc.ContainerDuration);
  ASDCP::PCM::FrameBuffer::~FrameBuffer((FrameBuffer *)&essence_descriptor);
  AS_02::PCM::MXFWriter::~MXFWriter((MXFWriter *)local_90);
  ASDCP::PCMParserList::~PCMParserList((PCMParserList *)&stack0xffffffffffffff80);
  return Options;
}

Assistant:

Result_t
write_PCM_file(CommandOptions& Options)
{
  AESEncContext*    Context = 0;
  HMACContext*      HMAC = 0;
  PCMParserList     Parser;
  AS_02::PCM::MXFWriter    Writer;
  PCM::FrameBuffer  FrameBuffer;
  ASDCP::MXF::WaveAudioDescriptor *essence_descriptor = 0;

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames, Options.edit_rate);

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
    {
      ASDCP::PCM::AudioDescriptor ADesc;
      Parser.FillAudioDescriptor(ADesc);

      ADesc.EditRate = Options.edit_rate;
      FrameBuffer.Capacity(PCM::CalcFrameBufferSize(ADesc));

      if ( Options.verbose_flag )
	{
	  char buf[64];
	  fprintf(stderr, "%.1fkHz PCM Audio, %s fps (%u spf)\n",
		  ADesc.AudioSamplingRate.Quotient() / 1000.0,
		  RationalToString(Options.edit_rate, buf, 64),
		  PCM::CalcSamplesPerFrame(ADesc));
	  fputs("AudioDescriptor:\n", stderr);
	  PCM::AudioDescriptorDump(ADesc);
	}

      essence_descriptor = new ASDCP::MXF::WaveAudioDescriptor(g_dict);

      result = ASDCP::PCM_ADesc_to_MD(ADesc, essence_descriptor);

      if ( Options.mca_config.empty() )
	{
	  essence_descriptor->ChannelAssignment = Options.channel_assignment;
	}
      else
	{
	  if ( Options.mca_config.ChannelCount() != essence_descriptor->ChannelCount )
	    {
	      fprintf(stderr, "MCA label count (%d) differs from essence stream channel count (%d).\n",
		      Options.mca_config.ChannelCount(), essence_descriptor->ChannelCount);
	      return RESULT_FAIL;
	    }

	  // This marks all soundfield groups using the same MCA property values
	  MXF::InterchangeObject_list_t::iterator i;
	  for ( i = Options.mca_config.begin(); i != Options.mca_config.end(); ++i )
	    {
	      MXF::SoundfieldGroupLabelSubDescriptor * desc = dynamic_cast<MXF::SoundfieldGroupLabelSubDescriptor*>(*i);
	      if ( desc != 0 )
		{
		  if ( ! Options.mca_audio_content_kind.empty() )
		    {
		      desc->MCAAudioContentKind = Options.mca_audio_content_kind;
		    }
		  if ( ! Options.mca_audio_element_kind.empty() )
		    {
		      desc->MCAAudioElementKind = Options.mca_audio_element_kind;
		    }
		}
	    }

	  essence_descriptor->ChannelAssignment = g_dict->ul(MDD_IMFAudioChannelCfg_MCA);
	}
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    {
      WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
      Info.LabelSetType = LS_MXF_SMPTE;

      if ( Options.asset_id_flag )
	memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
      else
	Kumu::GenRandomUUID(Info.AssetUUID);

#ifdef HAVE_OPENSSL
      // configure encryption
      if( Options.key_flag )
	{
      byte_t            IV_buf[CBC_BLOCK_SIZE];
      Kumu::FortunaRNG  RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
	    {
	      Info.UsesHMAC = true;
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	}
#endif // HAVE_OPENSSL

      if ( ASDCP_SUCCESS(result) )
	{
	  result = Writer.OpenWrite(Options.out_file.c_str(), Info, essence_descriptor,
				    Options.mca_config, Options.edit_rate);
	}
    }

  if ( ASDCP_SUCCESS(result) )
    {
      result = Parser.Reset();
      ui32_t duration = 0;

      while ( ASDCP_SUCCESS(result) && duration++ < Options.duration )
	{
	  result = Parser.ReadFrame(FrameBuffer);

	  if ( ASDCP_SUCCESS(result) )
	    {
	      if ( Options.verbose_flag )
		FrameBuffer.Dump(stderr, Options.fb_dump_size);

	      if ( ! Options.no_write_flag )
		{
		  result = Writer.WriteFrame(FrameBuffer, Context, HMAC);

		  // The Writer class will forward the last block of ciphertext
		  // to the encryption context for use as the IV for the next
		  // frame. If you want to use non-sequitur IV values, un-comment
		  // the following  line of code.
		  // if ( ASDCP_SUCCESS(result) && Options.key_flag )
		  //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
		}
	    }
	}

      if ( result == RESULT_ENDOFFILE )
	result = RESULT_OK;
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}